

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
          (dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *this,
          size_type count_in,const_reference value_in,allocator_type *alloc_in)

{
  pointer pcVar1;
  pointer pcVar2;
  allocator_type my_alloc;
  undefined8 uStack_18;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00216170;
  this->elem_count = count_in;
  this->elems = (pointer)0x0;
  if (count_in != 0) {
    uStack_18 = &PTR__dynamic_array_00216170;
    pcVar1 = std::allocator_traits<std::allocator<char>_>::allocate
                       ((allocator_type *)((long)&uStack_18 + 7),(ulong)count_in);
    this->elems = pcVar1;
    for (pcVar2 = pcVar1; pcVar2 != pcVar1 + this->elem_count; pcVar2 = pcVar2 + 1) {
      *pcVar2 = *value_in;
      pcVar1 = this->elems;
    }
  }
  return;
}

Assistant:

explicit constexpr dynamic_array(size_type count_in,
                                     const_reference value_in = value_type(),
                                     const allocator_type& alloc_in = allocator_type())
      : elem_count(count_in)
    {
      if(elem_count > static_cast<size_type>(UINT8_C(0)))
      {
        allocator_type my_alloc(alloc_in);

        elems = std::allocator_traits<allocator_type>::allocate(my_alloc, elem_count);

        iterator it = begin();

        while(it != end())
        {
          std::allocator_traits<allocator_type>::construct(my_alloc, it, value_in);

          ++it;
        }
      }
    }